

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taiwncal.cpp
# Opt level: O0

int __thiscall
icu_63::TaiwanCalendar::clone
          (TaiwanCalendar *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  TaiwanCalendar *this_00;
  undefined8 local_30;
  TaiwanCalendar *this_local;
  
  this_00 = (TaiwanCalendar *)UMemory::operator_new((UMemory *)0x290,(size_t)__fn);
  local_30 = (TaiwanCalendar *)0x0;
  if (this_00 != (TaiwanCalendar *)0x0) {
    TaiwanCalendar(this_00,this);
    local_30 = this_00;
  }
  return (int)local_30;
}

Assistant:

Calendar* TaiwanCalendar::clone(void) const
{
    return new TaiwanCalendar(*this);
}